

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O0

void __thiscall
AssertionMessageTest_emptyMessage_Test::TestBody(AssertionMessageTest_emptyMessage_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  string str;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  AssertionMessage message;
  AssertionMessageTest_emptyMessage_Test *this_local;
  
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&gtest_ar_.message_);
  bVar1 = cppassert::internal::AssertionMessage::empty((AssertionMessage *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_28,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&str.field_2 + 8),(internal *)local_28,
               (AssertionResult *)"message.empty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  cppassert::internal::AssertionMessage::str_abi_cxx11_
            ((string *)&gtest_ar__1.message_,(AssertionMessage *)&gtest_ar_.message_);
  bVar1 = (bool)std::__cxx11::string::empty();
  testing::AssertionResult::AssertionResult((AssertionResult *)local_98,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_98,(AssertionResult *)"str.empty()","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  cppassert::internal::AssertionMessage::~AssertionMessage((AssertionMessage *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(AssertionMessageTest, emptyMessage)
{
    cppassert::internal::AssertionMessage message;
    EXPECT_TRUE(message.empty());
    std::string str = message.str();
    EXPECT_TRUE(str.empty());
}